

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

void __thiscall
QSortFilterProxyModelPrivate::filter_changed
          (QSortFilterProxyModelPrivate *this,Directions directions,QModelIndex *source_parent)

{
  Span *pSVar1;
  QModelIndex *source_parent_00;
  int *piVar2;
  QModelIndex *pQVar3;
  bool bVar4;
  ulong uVar5;
  int i;
  Data *pDVar6;
  QModelIndex *source_parent_01;
  long lVar7;
  long in_FS_OFFSET;
  const_iterator cVar8;
  int local_90;
  int local_8c;
  QArrayDataPointer<int> local_88;
  QSet<int> columns_removed;
  QSet<int> rows_removed;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)(source_parent->m).ptr;
  local_58.d = *(Data **)source_parent;
  local_58.ptr = (QModelIndex *)source_parent->i;
  cVar8 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
          constFindImpl<QtPrivate::QModelIndexWrapper>
                    (&this->source_index_mapping,(QModelIndexWrapper *)&local_58);
  if (cVar8.i.d !=
      (Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
       *)0x0 || cVar8.i.bucket != 0) {
    pSVar1 = (cVar8.i.d)->spans;
    uVar5 = cVar8.i.bucket >> 7;
    source_parent_00 =
         *(QModelIndex **)
          (pSVar1[uVar5].entries[pSVar1[uVar5].offsets[(uint)cVar8.i.bucket & 0x7f]].storage.data +
          0x18);
    rows_removed.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
    if (((uint)directions.super_QFlagsStorageHelper<QSortFilterProxyModel::Direction,_4>.
               super_QFlagsStorage<QSortFilterProxyModel::Direction>.i & 1) == 0) {
      rows_removed.q_hash.d = (Hash)(Data *)0x0;
    }
    else {
      handle_filter_changed
                ((QSortFilterProxyModelPrivate *)&rows_removed,(QList<int> *)this,
                 (QList<int> *)(source_parent_00 + 2),source_parent_00,(Direction)source_parent);
    }
    columns_removed.q_hash.d = (Hash)&DAT_aaaaaaaaaaaaaaaa;
    if (((uint)directions.super_QFlagsStorageHelper<QSortFilterProxyModel::Direction,_4>.
               super_QFlagsStorage<QSortFilterProxyModel::Direction>.i & 2) == 0) {
      columns_removed.q_hash.d = (Hash)(Data *)0x0;
    }
    else {
      handle_filter_changed
                ((QSortFilterProxyModelPrivate *)&columns_removed,(QList<int> *)this,
                 (QList<int> *)(source_parent_00 + 3),source_parent_00 + 1,(Direction)source_parent)
      ;
    }
    local_58.d = *(Data **)(source_parent_00 + 4);
    local_58.ptr = (QModelIndex *)source_parent_00[4].i;
    local_58.size = (qsizetype)source_parent_00[4].m.ptr;
    if ((QObject *)local_58.d != (QObject *)0x0) {
      LOCK();
      (((QArrayData *)&((QObject *)local_58.d)->_vptr_QObject)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QObject *)local_58.d)->_vptr_QObject)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (int *)0x0;
    lVar7 = 0;
    for (pDVar6 = (Data *)0x0; pQVar3 = local_58.ptr, piVar2 = local_88.ptr,
        pDVar6 < (ulong)local_58.size;
        pDVar6 = (Data *)((long)&(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                                 _M_i + 1)) {
      source_parent_01 = (QModelIndex *)((long)&(local_58.ptr)->r + lVar7);
      local_8c = *(int *)((long)&(local_58.ptr)->r + lVar7);
      bVar4 = QHash<int,_QHashDummyValue>::contains(&rows_removed.q_hash,&local_8c);
      if (bVar4) {
LAB_0041b1af:
        QList<int>::append((QList<int> *)&local_88,(parameter_type)pDVar6);
        remove_from_mapping(this,source_parent_01);
      }
      else {
        local_90 = *(int *)((long)&pQVar3->c + lVar7);
        bVar4 = QHash<int,_QHashDummyValue>::contains(&columns_removed.q_hash,&local_90);
        if (bVar4) goto LAB_0041b1af;
        filter_changed(this,directions,source_parent_01);
      }
      lVar7 = lVar7 + 0x18;
    }
    for (lVar7 = local_88.size << 2; lVar7 != 0; lVar7 = lVar7 + -4) {
      QList<QModelIndex>::remove
                ((QList<QModelIndex> *)(source_parent_00 + 4),
                 (char *)(long)*(int *)((long)piVar2 + lVar7 + -4));
    }
    QArrayDataPointer<int>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
    QHash<int,_QHashDummyValue>::~QHash(&columns_removed.q_hash);
    QHash<int,_QHashDummyValue>::~QHash(&rows_removed.q_hash);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModelPrivate::filter_changed(Directions directions,
                                                  const QModelIndex &source_parent)
{
    IndexMap::const_iterator it = source_index_mapping.constFind(source_parent);
    if (it == source_index_mapping.constEnd())
        return;
    Mapping *m = it.value();
    const QSet<int> rows_removed = (directions & Direction::Rows)
                                 ? handle_filter_changed(m->proxy_rows, m->source_rows, source_parent,
                                                         Direction::Rows)
                                 : QSet<int>();
    const QSet<int> columns_removed = (directions & Direction::Columns)
                                 ? handle_filter_changed(m->proxy_columns, m->source_columns, source_parent,
                                                         Direction::Columns)
                                 : QSet<int>();

    // We need to iterate over a copy of m->mapped_children because otherwise it may be changed by other code, invalidating
    // the iterator it2.
    // The m->mapped_children vector can be appended to with indexes which are no longer filtered
    // out (in create_mapping) when this function recurses for child indexes.
    const QList<QModelIndex> mappedChildren = m->mapped_children;
    QList<int> indexesToRemove;
    for (int i = 0; i < mappedChildren.size(); ++i) {
        const QModelIndex &source_child_index = mappedChildren.at(i);
        if (rows_removed.contains(source_child_index.row()) || columns_removed.contains(source_child_index.column())) {
            indexesToRemove.push_back(i);
            remove_from_mapping(source_child_index);
        } else {
            filter_changed(directions, source_child_index);
        }
    }
    QList<int>::const_iterator removeIt = indexesToRemove.constEnd();
    const QList<int>::const_iterator removeBegin = indexesToRemove.constBegin();

    // We can't just remove these items from mappedChildren while iterating above and then
    // do something like m->mapped_children = mappedChildren, because mapped_children might
    // be appended to in create_mapping, and we would lose those new items.
    // Because they are always appended in create_mapping, we can still remove them by
    // position here.
    while (removeIt != removeBegin) {
        --removeIt;
        m->mapped_children.remove(*removeIt);
    }
}